

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O2

void __thiscall Txid_TxidFromHexError_Test::TestBody(Txid_TxidFromHexError_Test *this)

{
  bool bVar1;
  allocator local_51;
  string local_50;
  Txid txid;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_50,
               "123456789012345678901234567890123456789012345678901234567890123412",&local_51);
    cfd::core::Txid::Txid(&txid,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cfd::core::Txid::~Txid(&txid);
  }
  testing::Message::Message((Message *)&txid);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
             ,0x2d,
             "Expected: Txid txid = Txid( \"123456789012345678901234567890123456789012345678901234567890123412\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&txid);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&txid);
  return;
}

Assistant:

TEST(Txid, TxidFromHexError) {
  EXPECT_THROW(
      Txid txid = Txid( "123456789012345678901234567890123456789012345678901234567890123412"),
      CfdException);
}